

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O0

void __thiscall JetHead::vector<Regex::GroupData>::clear(vector<Regex::GroupData> *this)

{
  uint local_14;
  uint i;
  vector<Regex::GroupData> *this_local;
  
  for (local_14 = 0; local_14 < this->mSize; local_14 = local_14 + 1) {
    Regex::GroupData::~GroupData(this->mData + local_14);
  }
  this->mSize = 0;
  return;
}

Assistant:

void clear() 
		{ 
			// Call destructor-in-place, not delete (we didn't
			// allocate this object with new).  Destroy everything.
			for (unsigned i = 0; i < mSize; i++)
			{
				mData[i].~T();
			}

			// Nothing is left
			mSize = 0; 
		}